

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getDesc_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  pointer pAVar1;
  ostream *poVar2;
  Storage storage;
  InputType type;
  OutputType type_00;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream desc;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&desc);
  lVar3 = 0x1c;
  for (uVar5 = 0;
      pAVar1 = (this->arrays).
               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->arrays).
                            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 6);
      uVar5 = uVar5 + 1) {
    poVar2 = std::operator<<(local_1a8,"Array ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"Storage in ");
    Array::storageToString_abi_cxx11_
              (&local_1d8,(Array *)(ulong)*(uint *)((long)pAVar1 + lVar3 + -0x14),storage);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"stride ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)pAVar1 + lVar3 + -4));
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"input datatype ");
    Array::inputTypeToString_abi_cxx11_
              (&local_1f8,(Array *)(ulong)*(uint *)((long)pAVar1 + lVar3 + -0x1c),type);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"input component count ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)pAVar1 + lVar3 + -0xc));
    poVar2 = std::operator<<(poVar2,", ");
    pcVar4 = "";
    if (*(char *)((long)&pAVar1->inputType + lVar3) != '\0') {
      pcVar4 = "normalized, ";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"used as ");
    Array::outputTypeToString_abi_cxx11_
              (&local_218,(Array *)(ulong)*(uint *)((long)pAVar1 + lVar3 + -0x18),type_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_218);
    std::operator<<(poVar2,", ");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar3 = lVar3 + 0x40;
  }
  poVar2 = std::operator<<(local_1a8,"drawArrays(), ");
  poVar2 = std::operator<<(poVar2,"first ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->first);
  poVar2 = std::operator<<(poVar2,", ");
  std::ostream::operator<<(poVar2,this->drawCount);
  if (this->primitive == PRIMITIVE_POINTS) {
    pcVar4 = "points";
  }
  else {
    if (this->primitive != PRIMITIVE_TRIANGLES) goto LAB_004601e4;
    pcVar4 = "quads ";
  }
  std::operator<<(local_1a8,pcVar4);
LAB_004601e4:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&desc);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		desc
			<< "Array " << ndx << ": "
			<< "Storage in " << Array::storageToString(array.storage) << ", "
			<< "stride " << array.stride << ", "
			<< "input datatype " << Array::inputTypeToString((Array::InputType)array.inputType) << ", "
			<< "input component count " << array.componentCount << ", "
			<< (array.normalize ? "normalized, " : "")
			<< "used as " << Array::outputTypeToString(array.outputType) << ", ";
	}

	desc
		<< "drawArrays(), "
		<< "first " << first << ", "
		<< drawCount;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			desc << "quads ";
			break;
		case Array::PRIMITIVE_POINTS:
			desc << "points";
			break;

		default:
			DE_ASSERT(false);
			break;
	}


	return desc.str();
}